

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_extract.cpp
# Opt level: O3

void __thiscall
ktx::CommandExtract::saveEXR
          (CommandExtract *this,string *filepath,bool appendExtension,VkFormat vkFormat,
          FormatDescriptor *format,uint32_t width,uint32_t height,
          vector<int,_std::allocator<int>_> *pixelTypes,char *data,size_t size)

{
  pointer puVar1;
  pointer piVar2;
  CommandExtract *pCVar3;
  _EXRAttribute *p_Var4;
  iterator iVar5;
  char cVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  char *pcVar10;
  EXRChannelInfo *__dest;
  int *piVar11;
  EXRAttribute *pEVar12;
  void *pvVar13;
  byte bVar14;
  uint uVar15;
  ulong uVar16;
  size_t sVar17;
  Reporter *report;
  uint uVar18;
  undefined4 in_register_0000008c;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar19;
  uint uVar20;
  long lVar21;
  uint uVar22;
  ulong uVar23;
  string *psVar24;
  long lVar25;
  float fVar26;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  array<unsigned_int_*,_4UL> imagePtrs;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  images;
  EXRStruct exr;
  Primaries primaries;
  OutputStream file;
  uint local_3ec;
  uint32_t local_3e0;
  void *local_3d8;
  undefined8 uStack_3d0;
  long local_3c8;
  ulong local_3b8;
  pointer local_3b0;
  string local_3a8;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_380;
  FormatDescriptor *local_368;
  string *local_360;
  CommandExtract *local_358;
  ulong local_350;
  ulong local_348;
  ulong local_340;
  undefined1 local_338 [168];
  _EXRAttribute *local_290;
  iterator iStack_288;
  _EXRAttribute *local_280;
  char *pcStack_278;
  uchar *local_270;
  ulong local_268 [4];
  undefined1 local_248 [256];
  char local_148 [256];
  ulong *local_48;
  undefined8 local_40;
  
  aVar19._4_4_ = in_register_0000008c;
  aVar19._0_4_ = width;
  if ((format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (format->samples).
      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("!format.samples.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x367,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  if (appendExtension) {
    iVar7 = std::__cxx11::string::compare((char *)filepath);
    if (iVar7 != 0) {
      std::__cxx11::string::append((char *)filepath);
    }
  }
  local_3d8 = (void *)0x0;
  uStack_3d0 = 0;
  local_3c8 = 0;
  uVar16 = *(ulong *)&format->basic;
  if (((uint)uVar16 & 0xff) == 1) {
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (_khr_df_model_channels_e)
                      (format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(char *)&local_3d8);
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (_khr_df_model_channels_e)
                      (format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(char *)&local_3d8);
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (_khr_df_model_channels_e)
                      (format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(char *)&local_3d8);
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (_khr_df_model_channels_e)
                      (format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(char *)&local_3d8);
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (_khr_df_model_channels_e)
                      (format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(char *)&local_3d8);
    saveEXR(std::__cxx11::string,bool,VkFormat,FormatDescriptor_const&,unsigned_int,unsigned_int,std::vector<int,std::allocator<int>>const&,char_const*,unsigned_long)
    ::$_0::operator()((format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (_khr_df_model_channels_e)
                      (format->samples).
                      super__Vector_base<FormatDescriptor::sample,_std::allocator<FormatDescriptor::sample>_>
                      ._M_impl.super__Vector_impl_data._M_finish,(char *)&local_3d8);
  }
  else {
    pcVar10 = (char *)dfdToStringColorModel();
    if (pcVar10 == (char *)0x0) {
      local_248._0_8_ = uVar16 & 0xff;
      fmt.size_ = 2;
      fmt.data_ = (char *)0xa;
      args.field_1.args_ = aVar19.args_;
      args.desc_ = (unsigned_long_long)local_248;
      ::fmt::v10::vformat_abi_cxx11_((string *)local_338,(v10 *)"(0x{:02X})",fmt,args);
    }
    else {
      local_338._0_8_ = local_338 + 0x10;
      sVar17 = strlen(pcVar10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_338,pcVar10,pcVar10 + sVar17);
    }
    pcVar10 = (char *)vkFormatString(vkFormat);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_248,pcVar10,(allocator<char> *)&local_3a8);
    iVar7 = std::__cxx11::string::compare(local_248);
    if (iVar7 == 0) {
      local_268[0] = (ulong)vkFormat;
      fmt_00.size_ = 2;
      fmt_00.data_ = (char *)0xa;
      args_00.field_1.args_ = aVar19.args_;
      args_00.desc_ = (unsigned_long_long)local_268;
      ::fmt::v10::vformat_abi_cxx11_(&local_3a8,(v10 *)0x20aba6,fmt_00,args_00);
      if ((undefined1 *)local_248._0_8_ != local_248 + 0x10) {
        operator_delete((void *)local_248._0_8_,local_248._16_8_ + 1);
      }
    }
    else {
      local_3a8._M_dataplus._M_p = (pointer)&local_3a8.field_2;
      if ((undefined1 *)local_248._0_8_ == local_248 + 0x10) {
        local_3a8.field_2._8_8_ = local_248._24_8_;
      }
      else {
        local_3a8._M_dataplus._M_p = (pointer)local_248._0_8_;
      }
      local_3a8.field_2._M_allocated_capacity = local_248._16_8_;
      local_3a8._M_string_length = local_248._8_8_;
    }
    Reporter::fatal<char_const(&)[42],std::__cxx11::string,std::__cxx11::string>
              (&(this->super_Command).super_Reporter,NOT_SUPPORTED,
               (char (*) [42])"EXR saving is unsupported for {} with {}.",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_338,
               &local_3a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3a8._M_dataplus._M_p != &local_3a8.field_2) {
      operator_delete(local_3a8._M_dataplus._M_p,local_3a8.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
      operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
    }
  }
  uVar15 = (uint)(byte)(format->basic).field_0x8;
  local_3ec = 3;
  if (vkFormat != VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
    local_3ec = (format->extended).channelCount;
  }
  if (uVar15 * height * width != size) {
    __assert_fail("size == width * height * pixelBytes",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x392,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  local_3b8 = (ulong)local_3ec;
  if ((long)(pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 != local_3b8) {
    __assert_fail("numChannels == pixelTypes.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                  ,0x393,
                  "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                 );
  }
  local_360 = filepath;
  local_358 = this;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&local_380,local_3b8,(allocator_type *)local_248);
  local_3a8.field_2._M_allocated_capacity = 0;
  local_3a8.field_2._8_8_ = 0;
  local_3a8._M_dataplus._M_p = (pointer)0x0;
  local_3a8._M_string_length = 0;
  if (local_3ec != 0) {
    lVar25 = local_3b8 * 0x18;
    lVar21 = 0;
    do {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                 ((long)&((local_380.
                           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar21),(ulong)(height * width));
      lVar21 = lVar21 + 0x18;
    } while (lVar25 != lVar21);
  }
  pvVar13 = local_3d8;
  local_368 = format;
  if (height != 0) {
    local_350 = (ulong)width;
    local_3e0 = 0;
    do {
      if (width != 0) {
        local_348 = (ulong)(local_3e0 * width);
        uVar16 = 0;
        do {
          uVar22 = (int)local_348 + (int)uVar16;
          local_340 = uVar16;
          if (vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
            if (local_3ec != 3) {
              __assert_fail("numChannels == 3",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                            ,0x3a2,
                            "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                           );
            }
            if (*(pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start != 1) {
              __assert_fail("pixelTypes[0] == TINYEXR_PIXELTYPE_HALF",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                            ,0x3a3,
                            "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                           );
            }
            uVar18 = *(uint *)(data + uVar22 * uVar15);
            fVar26 = ldexpf(1.0,(uVar18 >> 0x1b) - 0x18);
            local_380.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[2].
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar22] = (uint)((float)(uVar18 & 0x1ff) * fVar26);
            local_380.
            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start[1].
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar22] = (uint)((float)(uVar18 >> 9 & 0x1ff) * fVar26)
            ;
            ((local_380.
              super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar22] =
                 (uint)((float)(uVar18 >> 0x12 & 0x1ff) * fVar26);
          }
          else if (local_3ec != 0) {
            local_3b0 = local_380.
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            piVar2 = (pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar16 = 0;
            do {
              uVar18 = *(uint *)((long)pvVar13 + uVar16 * 0x18 + 4);
              if (0x20 < uVar18) {
                __assert_fail("numBits <= sizeof(T) * 8",
                              "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                              ,0x8d,
                              "T imageio::extract_bits(const void *, uint32_t, uint32_t) [T = unsigned int]"
                             );
              }
              iVar7 = *(int *)((long)pvVar13 + uVar16 * 0x18);
              local_248._0_8_ = local_248._0_8_ & 0xffffffff00000000;
              if (uVar18 == 0) {
                fVar26 = 0.0;
              }
              else {
                uVar23 = 0;
                do {
                  uVar20 = iVar7 + (int)uVar23;
                  bVar14 = (byte)(1 << ((byte)uVar23 & 7));
                  if ((*(byte *)((long)(data + uVar22 * uVar15) + (ulong)(uVar20 >> 3)) >>
                       (uVar20 & 7) & 1) == 0) {
                    bVar14 = 0;
                  }
                  local_248[uVar23 >> 3] = local_248[uVar23 >> 3] | bVar14;
                  uVar20 = (int)uVar23 + 1;
                  uVar23 = (ulong)uVar20;
                } while (uVar18 != uVar20);
                fVar26 = (float)local_248._0_4_;
              }
              puVar1 = local_380.
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar16].
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              iVar7 = piVar2[uVar16];
              if (iVar7 - 1U < 2) {
                if (*(char *)((long)pvVar13 + uVar16 * 0x18 + 0x10) == '\x01') {
                  if (*(char *)((long)pvVar13 + uVar16 * 0x18 + 0x11) == '\x01') {
                    if (uVar18 == 0x10) {
                      uVar18 = (int)fVar26 << 0xd;
                      if ((uVar18 & 0xf800000) == 0xf800000) {
                        fVar9 = (float)(uVar18 & 0x1fffe000 | 0x70000000);
                      }
                      else if ((uVar18 & 0xf800000) == 0) {
                        fVar9 = (float)(uVar18 & 0x1fffe000 | 0x38800000) + -6.1035156e-05;
                      }
                      else {
                        fVar9 = (float)((uVar18 & 0xfffe000) + 0x38000000);
                      }
                      fVar26 = (float)(((uint)fVar26 & 0x8000) << 0x10 | (uint)fVar9);
                    }
                    else if (uVar18 != 0x20) {
                      __assert_fail("numBits == 16 || numBits == 32",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                    ,0xad,"float imageio::convertSFloatToFloat(uint32_t, uint32_t)")
                      ;
                    }
                  }
                  else {
                    if ((uVar18 & 0x3e) != 10) {
                      __assert_fail("numBits == 10 || numBits == 11",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                    ,0xb5,"float imageio::convertUFloatToFloat(uint32_t, uint32_t)")
                      ;
                    }
                    if (uVar18 == 10) {
                      if (fVar26 != 0.0) {
                        if ((fVar26 != 1.39009e-42) && (fVar26 != 1.43353e-42)) {
                          iVar7 = ((uint)fVar26 & 0x3ff) << 0x12;
                          goto LAB_00190329;
                        }
LAB_001902c5:
                        fVar26 = -1.0;
                      }
                    }
                    else if (fVar26 != 0.0) {
                      if ((fVar26 == 2.78018e-42) || (fVar26 == 2.86846e-42)) goto LAB_001902c5;
                      iVar7 = ((uint)fVar26 & 0x7ff) << 0x11;
LAB_00190329:
                      fVar26 = (float)(iVar7 + 0x38000000);
                    }
                  }
LAB_00190355:
                  puVar1[uVar22] = (uint)fVar26;
                }
                else {
                  cVar6 = *(char *)((long)pvVar13 + uVar16 * 0x18 + 0x11);
                  uVar20 = uVar18 - 1;
                  if (*(char *)((long)pvVar13 + uVar16 * 0x18 + 0x12) == '\x01') {
                    if (cVar6 == '\0') {
                      if (0x1f < uVar20) {
                        __assert_fail("numBits > 0 && numBits <= 32",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                      ,0xcd,"float imageio::convertUNORMToFloat(uint32_t, uint32_t)"
                                     );
                      }
                      bVar14 = (byte)uVar18;
                    }
                    else {
                      if (0x1f < uVar20) {
                        __assert_fail("numBits > 0 && numBits <= 32",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                      ,200,"float imageio::convertSNORMToFloat(uint32_t, uint32_t)")
                        ;
                      }
                      bVar14 = (byte)uVar20;
                    }
                    puVar1[uVar22] = (uint)((float)(uint)fVar26 / (float)~(-1 << (bVar14 & 0x1f)));
                  }
                  else {
                    if (cVar6 == '\0') {
                      if (0x1f < uVar20) {
                        __assert_fail("numBits > 0 && numBits <= 32",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                      ,0xc4,"float imageio::convertUIntToFloat(uint32_t, uint32_t)")
                        ;
                      }
                      fVar26 = (float)(uint)fVar26;
                    }
                    else {
                      if (0x1f < uVar20) {
                        __assert_fail("numBits > 0 && numBits <= 32",
                                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                      ,0xbd,"float imageio::convertSIntToFloat(uint32_t, uint32_t)")
                        ;
                      }
                      uVar8 = (uint)fVar26 & ~(1 << (uVar20 & 0x1f));
                      uVar18 = -uVar8;
                      if (((uint)fVar26 >> (uVar20 & 0x1f) & 1) == 0) {
                        uVar18 = uVar8;
                      }
                      fVar26 = (float)(int)uVar18;
                    }
                    puVar1[uVar22] = (uint)fVar26;
                  }
                }
              }
              else {
                if (iVar7 != 0) {
                  __assert_fail("false && \"Internal error\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/ktx/command_extract.cpp"
                                ,0x3d1,
                                "void ktx::CommandExtract::saveEXR(std::string, bool, VkFormat, const FormatDescriptor &, uint32_t, uint32_t, const std::vector<int> &, const char *, std::size_t)"
                               );
                }
                cVar6 = *(char *)((long)pvVar13 + uVar16 * 0x18 + 0x11);
                if (*(char *)((long)pvVar13 + uVar16 * 0x18 + 0x10) != '\x01') {
                  if (cVar6 != '\0') {
                    if (uVar18 - 1 < 0x20) {
                      __assert_fail("false && \"Not yet implemented\"",
                                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                    ,0xe4,"uint32_t imageio::convertSIntToUInt(uint32_t, uint32_t)")
                      ;
                    }
                    __assert_fail("numBits > 0 && numBits <= 32",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                  ,0xe1,"uint32_t imageio::convertSIntToUInt(uint32_t, uint32_t)");
                  }
                  if (0x1f < uVar18 - 1) {
                    __assert_fail("numBits > 0 && numBits <= 32",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                  ,0xe8,"uint32_t imageio::convertUIntToUInt(uint32_t, uint32_t)");
                  }
                  goto LAB_00190355;
                }
                if (cVar6 == '\0') {
                  if ((uVar18 < 0xf) && ((0x4c00U >> (uVar18 & 0x1f) & 1) != 0)) {
                    __assert_fail("false && \"Not yet implemented\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                  ,0xdd,"uint32_t imageio::convertUFloatToUInt(uint32_t, uint32_t)")
                    ;
                  }
                  __assert_fail("numBits == 10 || numBits == 11 || numBits == 14",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                ,0xda,"uint32_t imageio::convertUFloatToUInt(uint32_t, uint32_t)");
                }
                if (uVar18 == 0x10) {
                  uVar18 = (int)fVar26 << 0xd;
                  if ((uVar18 & 0xf800000) == 0xf800000) {
                    fVar9 = (float)(uVar18 & 0x1fffe000 | 0x70000000);
                  }
                  else if ((uVar18 & 0xf800000) == 0) {
                    fVar9 = (float)(uVar18 & 0x1fffe000 | 0x38800000) + -6.1035156e-05;
                  }
                  else {
                    fVar9 = (float)((uVar18 & 0xfffe000) + 0x38000000);
                  }
                  fVar26 = (float)(((uint)fVar26 & 0x8000) << 0x10 | (uint)fVar9);
                }
                else if (uVar18 != 0x20) {
                  __assert_fail("numBits == 16 || numBits == 32",
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/tools/imageio/./imageio_utility.h"
                                ,0xd2,"uint32_t imageio::convertSFloatToUInt(uint32_t, uint32_t)");
                }
                puVar1[uVar22] = (uint)(long)fVar26;
              }
              uVar18 = (int)uVar16 + 1;
              uVar16 = (ulong)uVar18;
            } while (uVar18 != local_3ec);
          }
          uVar16 = local_340 + 1;
        } while (uVar16 != local_350);
      }
      local_3e0 = local_3e0 + 1;
    } while (local_3e0 != height);
  }
  local_280 = (_EXRAttribute *)0x0;
  pcStack_278 = (char *)0x0;
  local_290 = (_EXRAttribute *)0x0;
  iStack_288._M_current = (_EXRAttribute *)0x0;
  local_270 = (uchar *)0x0;
  InitEXRHeader((EXRHeader *)local_338);
  InitEXRImage((EXRImage *)(local_338 + 0x88));
  psVar24 = &local_3a8;
  local_338._156_4_ = height;
  local_338._160_4_ = local_3ec;
  local_338._120_4_ = local_3ec;
  local_3b0 = (pointer)(long)(int)local_3ec;
  local_338._144_8_ = psVar24;
  local_338._152_4_ = width;
  __dest = (EXRChannelInfo *)malloc((long)local_3b0 * 0x110);
  pvVar13 = local_3d8;
  local_338._124_4_ = 0;
  local_338._104_8_ = __dest;
  if (local_3ec != 0) {
    lVar25 = local_3b8 * 0x18;
    lVar21 = 0;
    do {
      strncpy(__dest->name,*(char **)((long)pvVar13 + lVar21 + 8),0xff);
      (psVar24->_M_dataplus)._M_p =
           *(pointer *)
            ((long)&((local_380.
                      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                    super__Vector_impl_data._M_start + lVar21);
      __dest = __dest + 1;
      lVar21 = lVar21 + 0x18;
      psVar24 = (string *)&psVar24->_M_string_length;
    } while (lVar25 != lVar21);
  }
  sVar17 = (long)local_3b0 << 2;
  piVar11 = (int *)malloc(sVar17);
  local_338._112_8_ = piVar11;
  local_338._128_8_ = malloc(sVar17);
  if (0 < (int)local_3ec) {
    piVar2 = (pixelTypes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = 0;
    do {
      piVar11[uVar16] = (uint)(piVar2[uVar16] != 0) * 2;
      *(int *)(local_338._128_8_ + uVar16 * 4) = piVar2[uVar16];
      uVar16 = uVar16 + 1;
    } while (local_3b8 != uVar16);
  }
  cVar6 = getPrimaries((local_368->basic).field_0x1,local_268);
  if (cVar6 != '\0') {
    local_40._0_4_ = 0;
    local_40._4_4_ = 0;
    strncpy(local_248,"chromaticities",0x100);
    strncpy(local_148,"chromaticities",0x100);
    iVar5._M_current = iStack_288._M_current;
    local_40._0_4_ = 0x20;
    local_48 = local_268;
    if (iStack_288._M_current == local_280) {
      std::vector<_EXRAttribute,std::allocator<_EXRAttribute>>::
      _M_realloc_insert<_EXRAttribute_const&>
                ((vector<_EXRAttribute,std::allocator<_EXRAttribute>> *)&local_290,iStack_288,
                 (_EXRAttribute *)local_248);
    }
    else {
      memcpy(iStack_288._M_current,local_248,0x210);
      iStack_288._M_current = iVar5._M_current + 1;
    }
  }
  iVar5._M_current = iStack_288._M_current;
  p_Var4 = local_290;
  lVar25 = ((long)iStack_288._M_current - (long)local_290 >> 4) * 0xf83e0f83e0f83e1;
  local_338._92_4_ = (undefined4)lVar25;
  pEVar12 = (EXRAttribute *)malloc((long)iStack_288._M_current - (long)local_290);
  local_338._96_8_ = pEVar12;
  if (iVar5._M_current != p_Var4) {
    lVar25 = lVar25 + (ulong)(lVar25 == 0);
    lVar21 = 0;
    do {
      memcpy(pEVar12->name + lVar21,p_Var4->name + lVar21,0x210);
      lVar21 = lVar21 + 0x210;
      lVar25 = lVar25 + -1;
    } while (lVar25 != 0);
  }
  pvVar13 = (void *)SaveEXRImageToMemory
                              ((EXRImage *)(local_338 + 0x88),(EXRHeader *)local_338,&local_270,
                               &pcStack_278);
  pCVar3 = local_358;
  if (pvVar13 == (void *)0x0) {
    Reporter::fatal<char_const(&)[23],char_const*&>
              (&(local_358->super_Command).super_Reporter,IO_FAILURE,
               (char (*) [23])"EXR Encoder error: {}.",&pcStack_278);
  }
  report = &(pCVar3->super_Command).super_Reporter;
  OutputStream::OutputStream((OutputStream *)local_248,local_360,report);
  OutputStream::write((OutputStream *)local_248,(int)local_270,pvVar13,(size_t)report);
  OutputStream::~OutputStream((OutputStream *)local_248);
  saveEXR::EXRStruct::~EXRStruct((EXRStruct *)local_338);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&local_380);
  if (local_3d8 != (void *)0x0) {
    operator_delete(local_3d8,local_3c8 - (long)local_3d8);
  }
  return;
}

Assistant:

void CommandExtract::saveEXR(std::string filepath, bool appendExtension,
        VkFormat vkFormat, const FormatDescriptor& format, uint32_t width, uint32_t height,
        const std::vector<int>& pixelTypes, const char* data, std::size_t size) {
    assert(!format.samples.empty());

    if (appendExtension && filepath != "-")
        filepath += ".exr";

    struct Channel {
        uint32_t offset;
        uint32_t bits;
        const char* name;
        bool isFloat;
        bool isSigned;
        bool isNormalized;
    };
    std::vector<Channel> channels;

    if (format.model() == KHR_DF_MODEL_RGBSDA) {
        const auto addChannel = [&](auto channelType, const char* channelName) {
            if (const auto sample = format.find(channelType))
                channels.push_back({
                        sample->bitOffset,
                        sample->bitLength + 1u,
                        channelName,
                        sample->qualifierFloat != 0,
                        sample->qualifierSigned != 0,
                        sample->upper != (sample->qualifierFloat != 0 ? bit_cast<uint32_t>(1.0f) : 1u)
                });
        };

        // Must be ABGR order, since most of EXR viewers expect this channel order by convention.
        addChannel(KHR_DF_CHANNEL_RGBSDA_A, "A");
        addChannel(KHR_DF_CHANNEL_RGBSDA_D, "D");
        addChannel(KHR_DF_CHANNEL_RGBSDA_S, "S");
        addChannel(KHR_DF_CHANNEL_RGBSDA_B, "B");
        addChannel(KHR_DF_CHANNEL_RGBSDA_G, "G");
        addChannel(KHR_DF_CHANNEL_RGBSDA_R, "R");
    // } else if (formatDescriptor.model() == KHR_DF_MODEL_YUVSDA) {
    // Other color model support would come here
    } else {
        fatal(rc::NOT_SUPPORTED, "EXR saving is unsupported for {} with {}.", toString(format.model()), toString(vkFormat));
    }

    const auto pixelBytes = format.pixelByteCount();
    const auto numChannels = vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32 ? 3 : format.channelCount();
    assert(size == width * height * pixelBytes); (void) size;
    assert(numChannels == pixelTypes.size());

    // Image data is prepared with either floats or uint32
    // (half output is will be converted from float by TinyEXR during save)
    std::vector<std::vector<uint32_t>> images(numChannels);
    std::array<uint32_t*, 4> imagePtrs{};
    for (uint32_t i = 0; i < numChannels; ++i)
        images[i].resize(width * height);

    for (uint32_t y = 0; y < height; y++) {
        for (uint32_t x = 0; x < width; x++) {
            const char* rawPixel = data + (y * width + x) * pixelBytes;

            if (vkFormat == VK_FORMAT_E5B9G9R9_UFLOAT_PACK32) {
                // Special case for VK_FORMAT_E5B9G9R9_UFLOAT_PACK32
                assert(numChannels == 3);
                assert(pixelTypes[0] == TINYEXR_PIXELTYPE_HALF);
                uint32_t pixel;
                std::memcpy(&pixel, rawPixel, sizeof(uint32_t));
                const auto values = glm::unpackF3x9_E1x5(pixel);
                images[2][y * width + x] = bit_cast<uint32_t>(values.r);
                images[1][y * width + x] = bit_cast<uint32_t>(values.g);
                images[0][y * width + x] = bit_cast<uint32_t>(values.b);
            } else {
                for (uint32_t c = 0; c < numChannels; c++) {
                    const auto& channel = channels[c];
                    const auto offset = channel.offset;
                    const auto bits = channel.bits;

                    const auto value = extract_bits<uint32_t>(rawPixel, offset, bits);
                    auto& target = images[c][y * width + x];

                    if (pixelTypes[c] == TINYEXR_PIXELTYPE_FLOAT || pixelTypes[c] == TINYEXR_PIXELTYPE_HALF) {
                        if (channel.isFloat) {
                            if (channel.isSigned)
                                target = bit_cast<uint32_t>(convertSFloatToFloat(value, bits));
                            else
                                target = bit_cast<uint32_t>(convertUFloatToFloat(value, bits));
                        } else {
                            if (channel.isNormalized) {
                                if (channel.isSigned)
                                    target = bit_cast<uint32_t>(convertSNORMToFloat(value, bits));
                                else
                                    target = bit_cast<uint32_t>(convertUNORMToFloat(value, bits));
                            } else {
                                if (channel.isSigned)
                                    target = bit_cast<uint32_t>(convertSIntToFloat(value, bits));
                                else
                                    target = bit_cast<uint32_t>(convertUIntToFloat(value, bits));
                            }
                        }
                    } else if (pixelTypes[c] == TINYEXR_PIXELTYPE_UINT) {
                        if (channel.isFloat && channel.isSigned) {
                            target = convertSFloatToUInt(value, bits);
                        } else if (channel.isFloat && !channel.isSigned) {
                            target = convertUFloatToUInt(value, bits);
                        } else if (!channel.isFloat && channel.isSigned) {
                            target = convertSIntToUInt(value, bits);
                        } else if (!channel.isFloat && !channel.isSigned) {
                            target = convertUIntToUInt(value, bits);
                        }
                    } else
                        assert(false && "Internal error");
                }
            }
        }
    }

    struct EXRStruct {
        EXRHeader header;
        EXRImage image;
        std::vector<EXRAttribute> attributes;
        const char* err = nullptr;
        unsigned char* fileData = nullptr;
        EXRStruct() {
            InitEXRHeader(&header);
            InitEXRImage(&image);
        }
        ~EXRStruct() {
            if (header.custom_attributes != nullptr) {
                free(header.custom_attributes);
                header.custom_attributes = nullptr;
                header.num_custom_attributes = 0;
            }
            image.images = nullptr; // null out the images to stop TinyEXR from trying to free them
            FreeEXRImage(&image);
            FreeEXRHeader(&header);
            FreeEXRErrorMessage(err);
            free(fileData);
        }
        void addAttributesToHeader() {
            header.num_custom_attributes = static_cast<int>(attributes.size());
            header.custom_attributes = (EXRAttribute*)malloc(sizeof(EXRAttribute) * attributes.size());
            for (size_t i = 0; i < attributes.size(); ++i) {
                header.custom_attributes[i] = attributes[i];
            }
        }
    } exr;

    exr.image.images = reinterpret_cast<unsigned char**>(imagePtrs.data());
    exr.image.width = static_cast<int>(width);
    exr.image.height = static_cast<int>(height);
    exr.image.num_channels = static_cast<int>(numChannels);

    exr.header.num_channels = static_cast<int>(numChannels);
    exr.header.channels = (EXRChannelInfo*) malloc(sizeof(EXRChannelInfo) * exr.header.num_channels);
    // TODO: Question: Should we use a compression for exr outputs?
    exr.header.compression_type = TINYEXR_COMPRESSIONTYPE_NONE;

    for (uint32_t c = 0; c < numChannels; c++) {
        const auto& channel = channels[c];
        strncpy(exr.header.channels[c].name, channel.name, 255);
        imagePtrs[c] = images[c].data();
    }

    exr.header.pixel_types = (int *)malloc(sizeof(int) * exr.header.num_channels);
    exr.header.requested_pixel_types = (int *)malloc(sizeof(int) * exr.header.num_channels);
    for (int i = 0; i < exr.header.num_channels; i++) {
        // pixel type of the input image
        exr.header.pixel_types[i] = (pixelTypes[i] == TINYEXR_PIXELTYPE_UINT) ? TINYEXR_PIXELTYPE_UINT : TINYEXR_PIXELTYPE_FLOAT;
        // pixel type of the output image to be stored in .EXR file
        exr.header.requested_pixel_types[i] = pixelTypes[i];
    }

    // Output primaries as chromaticities
    Primaries primaries;
    bool foundPrimaries = getPrimaries(format.primaries(), &primaries);
    if (foundPrimaries) {
        EXRAttribute chromaticities{};
        strncpy(chromaticities.name, "chromaticities", sizeof(chromaticities.name));
        strncpy(chromaticities.type, "chromaticities", sizeof(chromaticities.type));
        chromaticities.size = sizeof(primaries);
        chromaticities.value = reinterpret_cast<unsigned char*>(&primaries);

        exr.attributes.push_back(chromaticities);
    }

    exr.addAttributesToHeader();
    std::size_t fileDataSize = SaveEXRImageToMemory(&exr.image, &exr.header, &exr.fileData, &exr.err);
    if (fileDataSize == 0)
        fatal(rc::IO_FAILURE, "EXR Encoder error: {}.", exr.err);

    OutputStream file(filepath, *this);
    file.write(reinterpret_cast<const char*>(exr.fileData), fileDataSize, *this);
}